

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O2

void Llb_MnxStop(Llb_Mnx_t *p)

{
  long lVar1;
  DdNode *pDVar2;
  int iVar3;
  DdManager *dd;
  Vec_Ptr_t *pVVar4;
  double dVar5;
  double dVar6;
  
  if (p->pPars->fVerbose != 0) {
    dd = p->dd;
    lVar1 = Cudd_ReadReorderingTime(dd);
    p->timeReo = lVar1;
    p->timeOther = p->timeTotal - (p->timeImage + p->timeRemap);
    iVar3 = (int)dd;
    Abc_Print(iVar3,"%s =","Image    ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeImage * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeImage / 1000000.0,dVar5);
    Abc_Print(iVar3,"%s =","Remap    ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeRemap * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeRemap / 1000000.0,dVar5);
    Abc_Print(iVar3,"%s =","Other    ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar5);
    Abc_Print(iVar3,"%s =","TOTAL    ");
    dVar6 = (double)p->timeTotal;
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = (dVar6 * 100.0) / dVar6;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",dVar6 / 1000000.0,dVar5);
    Abc_Print(iVar3,"%s =","  reo    ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeReo * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeReo / 1000000.0,dVar5);
  }
  if (p->bBad != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->dd,p->bBad);
  }
  if (p->bReached != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->dd,p->bReached);
  }
  if (p->bCurrent != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->dd,p->bCurrent);
  }
  if (p->bNext != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->dd,p->bNext);
  }
  pVVar4 = p->vRings;
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    for (iVar3 = 0; iVar3 < pVVar4->nSize; iVar3 = iVar3 + 1) {
      pDVar2 = (DdNode *)Vec_PtrEntry(pVVar4,iVar3);
      Cudd_RecursiveDeref(p->dd,pDVar2);
      pVVar4 = p->vRings;
    }
  }
  pVVar4 = p->vRoots;
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    for (iVar3 = 0; iVar3 < pVVar4->nSize; iVar3 = iVar3 + 1) {
      pDVar2 = (DdNode *)Vec_PtrEntry(pVVar4,iVar3);
      Cudd_RecursiveDeref(p->dd,pDVar2);
      pVVar4 = p->vRoots;
    }
  }
  Vec_PtrFreeP(&p->vRings);
  Vec_PtrFreeP(&p->vRoots);
  Extra_StopManager(p->dd);
  Vec_IntFreeP(&p->vOrder);
  Vec_IntFreeP(&p->vVars2Q);
  free(p);
  return;
}

Assistant:

void Llb_MnxStop( Llb_Mnx_t * p )
{
    DdNode * bTemp;
    int i;
    if ( p->pPars->fVerbose ) 
    {
        p->timeReo = Cudd_ReadReorderingTime(p->dd);
        p->timeOther = p->timeTotal - p->timeImage - p->timeRemap;
        ABC_PRTP( "Image    ", p->timeImage, p->timeTotal );
        ABC_PRTP( "Remap    ", p->timeRemap, p->timeTotal );
        ABC_PRTP( "Other    ", p->timeOther, p->timeTotal );
        ABC_PRTP( "TOTAL    ", p->timeTotal, p->timeTotal );
        ABC_PRTP( "  reo    ", p->timeReo,   p->timeTotal );
    }
    // remove BDDs
    if ( p->bBad )
        Cudd_RecursiveDeref( p->dd, p->bBad );
    if ( p->bReached )
        Cudd_RecursiveDeref( p->dd, p->bReached );
    if ( p->bCurrent )
        Cudd_RecursiveDeref( p->dd, p->bCurrent );
    if ( p->bNext )
        Cudd_RecursiveDeref( p->dd, p->bNext );
    if ( p->vRings )
    Vec_PtrForEachEntry( DdNode *, p->vRings, bTemp, i )
        Cudd_RecursiveDeref( p->dd, bTemp );
    if ( p->vRoots )
    Vec_PtrForEachEntry( DdNode *, p->vRoots, bTemp, i )
        Cudd_RecursiveDeref( p->dd, bTemp );
    // remove arrays
    Vec_PtrFreeP( &p->vRings );
    Vec_PtrFreeP( &p->vRoots );
//Cudd_PrintInfo( p->dd, stdout );
    Extra_StopManager( p->dd );
    Vec_IntFreeP( &p->vOrder );
    Vec_IntFreeP( &p->vVars2Q );
    ABC_FREE( p );
}